

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

bool __thiscall glslang::TIntermediate::addUsedConstantId(TIntermediate *this,int id)

{
  bool bVar1;
  _Node_iterator_base<int,_false> local_30;
  _Node_iterator_base<int,_false> local_28;
  int local_1c;
  TIntermediate *pTStack_18;
  int id_local;
  TIntermediate *this_local;
  
  local_1c = id;
  pTStack_18 = this;
  local_28._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                 (&this->usedConstantId,&local_1c);
  local_30._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 (&this->usedConstantId);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
              (&this->usedConstantId,&local_1c);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::addUsedConstantId(int id)
{
    if (usedConstantId.find(id) != usedConstantId.end())
        return false;

    usedConstantId.insert(id);

    return true;
}